

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O1

TestResult * __thiscall
JsonTest::TestResult::addFailure(TestResult *this,char *file,uint line,char *expr)

{
  PredicateContext *pPVar1;
  _Elt_pointer pFVar2;
  uint nestingLevel;
  
  nestingLevel = 0;
  for (pPVar1 = (this->rootPredicateNode_).next_; pPVar1 != (PredicateContext *)0x0;
      pPVar1 = pPVar1->next_) {
    if (this->lastUsedPredicateId_ < pPVar1->id_) {
      this->lastUsedPredicateId_ = pPVar1->id_;
      addFailureInfo(this,pPVar1->file_,pPVar1->line_,pPVar1->expr_,nestingLevel);
      pFVar2 = (this->failures_).
               super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pFVar2 == (this->failures_).
                    super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_first) {
        pFVar2 = (this->failures_).
                 super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 5;
      }
      pPVar1->failure_ = pFVar2 + -1;
    }
    nestingLevel = nestingLevel + 1;
  }
  addFailureInfo(this,file,line,expr,nestingLevel);
  pFVar2 = (this->failures_).
           super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pFVar2 == (this->failures_).
                super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pFVar2 = (this->failures_).
             super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  this->messageTarget_ = pFVar2 + -1;
  return this;
}

Assistant:

TestResult&
TestResult::addFailure(const char* file, unsigned int line, const char* expr) {
  /// Walks the PredicateContext stack adding them to failures_ if not already
  /// added.
  unsigned int nestingLevel = 0;
  PredicateContext* lastNode = rootPredicateNode_.next_;
  for (; lastNode != 0; lastNode = lastNode->next_) {
    if (lastNode->id_ > lastUsedPredicateId_) // new PredicateContext
    {
      lastUsedPredicateId_ = lastNode->id_;
      addFailureInfo(
          lastNode->file_, lastNode->line_, lastNode->expr_, nestingLevel);
      // Link the PredicateContext to the failure for message target when
      // popping the PredicateContext.
      lastNode->failure_ = &(failures_.back());
    }
    ++nestingLevel;
  }

  // Adds the failed assertion
  addFailureInfo(file, line, expr, nestingLevel);
  messageTarget_ = &(failures_.back());
  return *this;
}